

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

void __thiscall
Variable_addEquivalenceSecondParameterNullptr_Test::TestBody
          (Variable_addEquivalenceSecondParameterNullptr_Test *this)

{
  string *psVar1;
  byte bVar2;
  char cVar3;
  VariablePtr v1;
  AssertionResult gtest_ar_;
  ComponentPtr comp1;
  ModelPtr m;
  AssertionResult local_88;
  long local_78 [3];
  long *local_60;
  AssertHelper local_58 [8];
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  byte local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  psVar1 = local_20;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"modelName","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  psVar1 = local_30;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"component1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  psVar1 = local_50;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"variable1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"dimensionless","");
  libcellml::Variable::setUnits(local_50);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  libcellml::Component::addVariable((shared_ptr *)local_30);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_20);
  local_88._0_8_ = (long *)0x0;
  local_88.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar2 = libcellml::Variable::addEquivalence((shared_ptr *)&local_50,(shared_ptr *)&local_88);
  local_40[0] = bVar2 ^ 1;
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_88.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar2 == 0) goto LAB_001216fc;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.message_.ptr_);
    if ((local_40[0] & 1) != 0) goto LAB_001216fc;
  }
  testing::Message::Message((Message *)&local_60);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_88,(char *)local_40,"libcellml::Variable::addEquivalence(v1, nullptr)","true");
  testing::internal::AssertHelper::AssertHelper
            (local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
             ,0x551,(char *)local_88._0_8_);
  testing::internal::AssertHelper::operator=(local_58,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper(local_58);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (((local_60 != (long *)0x0) && (cVar3 = testing::internal::IsTrue(true), cVar3 != '\0')) &&
     (local_60 != (long *)0x0)) {
    (**(code **)(*local_60 + 8))();
  }
LAB_001216fc:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Variable, addEquivalenceSecondParameterNullptr)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();

    m->setName("modelName");
    comp1->setName("component1");

    v1->setName("variable1");

    v1->setUnits("dimensionless");

    comp1->addVariable(v1);

    m->addComponent(comp1);

    EXPECT_FALSE(libcellml::Variable::addEquivalence(v1, nullptr));
}